

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint uVar7;
  
  uVar7 = insn & 0x1f;
  uVar5 = insn >> 10 & 0x1f;
  uVar1 = MCInst_getOpcode(Inst);
  puVar6 = GPR32DecoderTable;
  DVar2 = MCDisassembler_Fail;
  uVar3 = uVar7;
  if ((int)uVar1 < 0x737) {
    switch(uVar1) {
    case 0x3a3:
    case 0x3a4:
    case 0x3a5:
    case 0x3a9:
    case 0x3aa:
    case 0x3ab:
      break;
    case 0x3a6:
    case 0x3ac:
switchD_00166a04_caseD_3a6:
      puVar6 = GPR64DecoderTable;
      break;
    case 0x3a7:
      goto switchD_00166a04_caseD_3a7;
    case 0x3a8:
switchD_00166a04_caseD_3a8:
      puVar6 = GPR64DecoderTable;
      goto LAB_00166ac3;
    default:
      switch(uVar1) {
      case 0x427:
        goto switchD_00166a04_caseD_3a7;
      case 0x428:
        goto switchD_00166a04_caseD_3a8;
      case 0x429:
      case 0x42a:
      case 0x42b:
        break;
      case 0x42c:
        goto switchD_00166a04_caseD_3a6;
      default:
        goto switchD_00166a4c_default;
      }
    }
  }
  else {
    uVar4 = insn >> 0x10 & 0x1f;
    switch(uVar1) {
    case 0x737:
    case 0x738:
    case 0x739:
      goto switchD_00166a04_caseD_3a3;
    case 0x73a:
      goto switchD_00166a04_caseD_3a6;
    case 0x73b:
switchD_00166a2a_caseD_73b:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      break;
    case 0x73c:
switchD_00166a2a_caseD_73c:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_00166a04_caseD_3a8;
    case 0x73d:
    case 0x73e:
    case 0x73f:
switchD_00166a2a_caseD_73d:
      puVar6 = GPR32DecoderTable;
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_00166a04_caseD_3a3;
    case 0x740:
switchD_00166a2a_caseD_740:
      MCOperand_CreateReg0(Inst,GPR32DecoderTable[uVar4]);
      goto switchD_00166a04_caseD_3a6;
    default:
      switch(uVar1) {
      case 0x78f:
        goto switchD_00166a2a_caseD_73b;
      case 0x790:
        goto switchD_00166a2a_caseD_73c;
      case 0x791:
      case 0x792:
      case 0x793:
        goto switchD_00166a2a_caseD_73d;
      case 0x794:
        goto switchD_00166a2a_caseD_740;
      default:
        goto switchD_00166a4c_default;
      }
    }
switchD_00166a04_caseD_3a7:
    puVar6 = GPR32DecoderTable;
LAB_00166ac3:
    MCOperand_CreateReg0(Inst,puVar6[uVar7]);
    uVar3 = uVar5;
  }
switchD_00166a04_caseD_3a3:
  uVar4 = insn >> 5 & 0x1f;
  MCOperand_CreateReg0(Inst,puVar6[uVar3]);
  uVar3 = 4;
  if (uVar4 != 0x1f) {
    uVar3 = GPR64DecoderTable[uVar4];
  }
  MCOperand_CreateReg0(Inst,uVar3);
  if (((1 < uVar1 - 0x427) && (1 < uVar1 - 0x3a7)) ||
     (DVar2 = MCDisassembler_SoftFail, uVar7 != uVar5)) {
    DVar2 = MCDisassembler_Success;
  }
switchD_00166a4c_default:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeExclusiveLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rt2 = fieldFromInstruction(insn, 10, 5);
	unsigned Rs = fieldFromInstruction(insn, 16, 5);
	unsigned Opcode = MCInst_getOpcode(Inst);

	switch (Opcode) {
		default:
			return Fail;
		case AArch64_STLXRW:
		case AArch64_STLXRB:
		case AArch64_STLXRH:
		case AArch64_STXRW:
		case AArch64_STXRB:
		case AArch64_STXRH:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARW:
		case AArch64_LDARB:
		case AArch64_LDARH:
		case AArch64_LDAXRW:
		case AArch64_LDAXRB:
		case AArch64_LDAXRH:
		case AArch64_LDXRW:
		case AArch64_LDXRB:
		case AArch64_LDXRH:
		case AArch64_STLRW:
		case AArch64_STLRB:
		case AArch64_STLRH:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXRX:
		case AArch64_STXRX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDARX:
		case AArch64_LDAXRX:
		case AArch64_LDXRX:
		case AArch64_STLRX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_STLXPW:
		case AArch64_STXPW:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPW:
		case AArch64_LDXPW:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR32RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
		case AArch64_STLXPX:
		case AArch64_STXPX:
			DecodeGPR32RegisterClass(Inst, Rs, Addr, Decoder);
			// FALLTHROUGH
		case AArch64_LDAXPX:
		case AArch64_LDXPX:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			DecodeGPR64RegisterClass(Inst, Rt2, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);

	// You shouldn't load to the same register twice in an instruction...
	if ((Opcode == AArch64_LDAXPW || Opcode == AArch64_LDXPW ||
				Opcode == AArch64_LDAXPX || Opcode == AArch64_LDXPX) &&
			Rt == Rt2)
		return SoftFail;

	return Success;
}